

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void design_artifact(artifact_set_data *data,wchar_t tv,int *aidx)

{
  long lVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  artifact *a_dst;
  char *str;
  char *pcVar4;
  bool bVar5;
  int local_220;
  int local_21c;
  int local_218;
  int local_208;
  int local_204;
  int local_200;
  int local_1f4;
  _Bool local_1e1;
  wchar_t local_1e0;
  wchar_t base_power;
  char *new_name;
  wchar_t power;
  artifact *a_old;
  wchar_t tval;
  int iStack_1b4;
  _Bool hurt_me;
  wchar_t ap;
  wchar_t alloc_new;
  wchar_t tries;
  wchar_t art_level;
  wchar_t art_freq [94];
  object_kind *kind;
  artifact *art;
  int *aidx_local;
  wchar_t tv_local;
  artifact_set_data *data_local;
  
  kind = (object_kind *)(a_info + *aidx);
  art_freq._368_8_ = lookup_kind(kind->kidx,kind->tval);
  alloc_new = kind->modifiers[8].sides;
  local_1e0 = tv;
  if (tv == L'\0') {
    local_1e0 = get_base_item_tval(data);
  }
  a_old._0_4_ = local_1e0;
  a_dst = (artifact *)mem_zalloc(0x140);
  new_name._4_4_ =
       Rand_sample(data->avg_tv_power[local_1e0],data->max_tv_power[local_1e0],
                   data->min_tv_power[local_1e0],0x14,0x14);
  str = artifact_gen_name((artifact *)kind,name_sections);
  while( true ) {
    pcVar4 = strstr(kind->name,"The One Ring");
    local_1e1 = true;
    if (pcVar4 == (char *)0x0) {
      local_1e1 = flag_has_dbg((bitflag *)(art_freq._368_8_ + 0x85),2,5,"kind->kind_flags",
                               "KF_QUEST_ART");
    }
    if (local_1e1 == false) break;
    *aidx = *aidx + 1;
    if ((int)(uint)z_info->a_max <= *aidx) {
      string_free(str);
      mem_free(a_dst);
      return;
    }
    kind = (object_kind *)(a_info + *aidx);
    alloc_new = kind->modifiers[8].sides;
  }
  string_free(kind->name);
  kind->name = str;
  file_putf(log_file,">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
  file_putf(log_file,"Artifact %d: power = %d\n",(ulong)(uint)*aidx,(ulong)new_name._4_4_);
  bVar5 = (int)new_name._4_4_ < 0;
  if (bVar5) {
    new_name._4_4_ = -new_name._4_4_;
  }
  for (ap = L'\0'; ap < L'È'; ap = ap + L'\x01') {
    if ((wchar_t)a_old == L'\0') {
      a_old._0_4_ = get_base_item_tval(data);
    }
    art_freq._368_8_ = get_base_item(data,(wchar_t)a_old);
    artifact_prep((artifact *)kind,(object_kind *)art_freq._368_8_,data);
    art_freq._368_8_ = lookup_kind(kind->kidx,kind->tval);
    wVar2 = artifact_power(*aidx,"for base item power",true);
    file_putf(log_file,"Base item power %d\n",(ulong)(uint)wVar2);
    if ((wVar2 <= (int)(new_name._4_4_ * 6) / 10 + L'\x01') || (0x13 < new_name._4_4_ - wVar2))
    break;
    file_putf(log_file,"Power too high!\n",(long)(int)(new_name._4_4_ * 6) % 10 & 0xffffffff);
  }
  if (L'Ç' < ap) {
    file_putf(log_file,"Warning! Couldn\'t get appropriate power level on base item.\n");
  }
  build_freq_table((artifact *)kind,&tries,data);
  copy_artifact((artifact *)kind,a_dst);
  try_supercharge((artifact *)kind,new_name._4_4_,data);
  tval = artifact_power(*aidx,"result of supercharge",true);
  if ((int)(new_name._4_4_ * 0x17) / 0x14 + L'\x01' < tval) {
    copy_artifact(a_dst,(artifact *)kind);
    file_putf(log_file,"--- Supercharge is too powerful! Rolling back.\n");
  }
  if (data->neg_power_total < 3) {
    local_1f4 = 2;
  }
  else {
    local_1f4 = data->neg_power_total;
  }
  uVar3 = Rand_div((int)(uint)z_info->a_max / local_1f4);
  a_old._7_1_ = uVar3 == 0 || bVar5;
  ap = L'\0';
  do {
    if (L'Ç' < ap) {
LAB_001d2b5a:
      if (L'Ç' < ap) {
        file_putf(log_file,"Warning!  Couldn\'t get appropriate power level on artifact.\n");
      }
      mem_free(a_dst->slays);
      mem_free(a_dst->brands);
      mem_free(a_dst->curses);
      mem_free(a_dst);
      if (*(int *)(art_freq._368_8_ + 0x210) == 0) {
        local_200 = 0x14;
      }
      else {
        local_200 = *(int *)(art_freq._368_8_ + 0x210);
      }
      iStack_1b4 = (int)(4000000 / (long)(tval * tval)) / local_200;
      if (99 < iStack_1b4) {
        iStack_1b4 = 99;
      }
      if (iStack_1b4 < 1) {
        iStack_1b4 = 1;
      }
      kind->modifiers[8].m_bonus = iStack_1b4;
      if ((tval * 3) / 5 < 0x7f) {
        local_204 = (tval * 3) / 5;
      }
      else {
        local_204 = 0x7f;
      }
      kind->modifiers[9].dice = local_204;
      if (((tval + L'd') * 100) / data->max_power < 100) {
        local_208 = ((tval + L'd') * 100) / data->max_power;
      }
      else {
        local_208 = 100;
      }
      kind->modifiers[9].base = local_208;
      uVar3 = Rand_div((int)new_name._4_4_ / 0x14 + 5);
      if (uVar3 == 0) {
        uVar3 = Rand_div(0x14);
        kind->modifiers[8].m_bonus = uVar3 + 1 + kind->modifiers[8].m_bonus;
        if (99 < kind->modifiers[8].m_bonus) {
          kind->modifiers[8].m_bonus = 99;
        }
      }
      else {
        uVar3 = Rand_div((int)new_name._4_4_ / 0x14 + 5);
        if ((uVar3 == 0) &&
           (kind->modifiers[9].base = kind->modifiers[9].base / 2, kind->modifiers[9].base < 1)) {
          kind->modifiers[9].base = 1;
        }
      }
      if (kind->modifiers[9].base * 2 < 0x80) {
        local_218 = kind->modifiers[9].base << 1;
      }
      else {
        local_218 = 0x7f;
      }
      if (kind->modifiers[9].dice < local_218) {
        if (kind->modifiers[9].base * 2 < 0x80) {
          local_21c = kind->modifiers[9].base << 1;
        }
        else {
          local_21c = 0x7f;
        }
        local_220 = local_21c;
      }
      else {
        local_220 = kind->modifiers[9].dice;
      }
      kind->modifiers[9].dice = local_220;
      lVar1._0_4_ = kind->modifiers[9].sides;
      lVar1._4_4_ = kind->modifiers[9].m_bonus;
      if (((lVar1 == 0) && (*(long *)(art_freq._368_8_ + 0x220) == 0)) &&
         (*(long *)(art_freq._368_8_ + 0x228) == 0)) {
        kind->modifiers[8].sides = kind->modifiers[9].base;
      }
      file_putf(log_file,"New depths are min %d, max %d\n",(ulong)(uint)kind->modifiers[9].base,
                (ulong)(uint)kind->modifiers[9].dice);
      file_putf(log_file,"Power-based alloc_prob is %d\n",(ulong)(uint)kind->modifiers[8].m_bonus);
      file_putf(log_file,"<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
      file_putf(log_file,"Number of tries for artifact %d was: %d\n",(ulong)(uint)*aidx,
                (ulong)(uint)ap);
      describe_artifact(*aidx,tval);
      return;
    }
    copy_artifact((artifact *)kind,a_dst);
    add_ability((artifact *)kind,new_name._4_4_,&tries,data);
    remove_contradictory((artifact *)kind);
    tval = artifact_power(*aidx,"artifact attempt",true);
    if (tval < L'\0') {
      tval = -tval;
      goto LAB_001d2b5a;
    }
    if (a_old._7_1_) {
      make_bad((artifact *)kind,alloc_new);
      uVar3 = Rand_div(3);
      if (uVar3 == 0) {
        a_old._7_1_ = false;
      }
    }
    if ((int)(new_name._4_4_ * 0x17) / 0x14 + L'\x01' < tval) {
      copy_artifact(a_dst,(artifact *)kind);
      file_putf(log_file,"--- Too powerful!  Rolling back.\n");
    }
    else if ((int)(new_name._4_4_ * 0x13) / 0x14 <= tval) goto LAB_001d2b5a;
    ap = ap + L'\x01';
  } while( true );
}

Assistant:

static void design_artifact(struct artifact_set_data *data, int tv, int *aidx)
{
	struct artifact *art = &a_info[*aidx];
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int art_freq[ART_IDX_TOTAL];
	int art_level = art->level;
	int tries;
	int alloc_new;
	int ap = 0;
	bool hurt_me = false;

	/* Set tval if necessary */
	int tval = (tv == TV_NULL) ? get_base_item_tval(data) : tv;

	/* Structure to hold the old artifact */
	struct artifact *a_old = mem_zalloc(sizeof *a_old);

	/* Choose a power for the artifact */
	int power = Rand_sample(data->avg_tv_power[tval],
							data->max_tv_power[tval],
							data->min_tv_power[tval],
							20, 20);

	/* Choose a name */
	char *new_name = artifact_gen_name(art, name_sections);

	/* Skip fixed artifacts */
	while (strstr(art->name, "The One Ring") ||
		kf_has(kind->kind_flags, KF_QUEST_ART)) {
		(*aidx)++;
		if ((*aidx) >= z_info->a_max) {
			string_free(new_name);
			mem_free(a_old);
			return;
		}
		art = &a_info[*aidx];
		art_level = art->level;
	}

	/* Apply the new name */
	string_free(art->name);
	art->name = new_name;

	file_putf(log_file, ">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
	file_putf(log_file, "Artifact %d: power = %d\n", *aidx, power);

	/* Flip the sign on power if it's negative (unlikely) and damage */
	if (power < 0) {
		hurt_me = true;
		power = -power;
	}

	/* Choose a base item typen not too powerful, so we'll have to add to it. */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		int base_power = 0;

		/* Get the new item kind and do basic prep on it */
		if (tval == TV_NULL) {
			tval = get_base_item_tval(data);
		}
		kind = get_base_item(data, tval);
		artifact_prep(art, kind, data);

		/* Get the kind again in case it's changed */
		kind = lookup_kind(art->tval, art->sval);

		base_power = artifact_power(*aidx, "for base item power", true);
		file_putf(log_file, "Base item power %d\n", base_power);

		/* New base item power too close to target artifact power */
		if ((base_power > (power * 6) / 10 + 1) && (power - base_power < 20)) {
			file_putf(log_file, "Power too high!\n");
			continue;
		}

		/* Acceptable */
		break;
	};

	/* Failed to get a good base item */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning! Couldn't get appropriate power level on base item.\n");

	/* Generate the cumulative frequency table for this base item type */
	build_freq_table(art, art_freq, data);

	/* Copy artifact info temporarily. */
	copy_artifact(art, a_old);

	/* Give this artifact a shot at being supercharged */
	try_supercharge(art, power, data);
	ap = artifact_power(*aidx, "result of supercharge", true);
	if (ap > (power * 23) / 20 + 1)	{
		/* Too powerful -- put it back */
		copy_artifact(a_old, art);
		file_putf(log_file, "--- Supercharge is too powerful! Rolling back.\n");
	}

	/* Give this artifact a chance to be cursed - note it retains its power */
	if (one_in_(z_info->a_max / MAX(2, data->neg_power_total))) {
		hurt_me = true;
	}

	/* Do the actual artifact design */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		/* Copy artifact info temporarily. */
		copy_artifact(art, a_old);

		/* Add an ability */
		add_ability(art, power, art_freq, data);
		remove_contradictory(art);

		/* Check the power, handle negative power */
		ap = artifact_power(*aidx, "artifact attempt", true);
		if (ap < 0) {
			ap = -ap;
			break;
		}

		/* Curse the designated artifacts */
		if (hurt_me) {
			make_bad(art, art_level);
			if (one_in_(3)) {
				hurt_me = false;
			}
		}

		/* Check power */
		if (ap > (power * 23) / 20 + 1) {
			/* Too powerful -- put it back */
			copy_artifact(a_old, art);
			file_putf(log_file, "--- Too powerful!  Rolling back.\n");
			continue;
		} else if (ap >= (power * 19) / 20) {
			/* Just right */
			break;
		}
	}

	/* Couldn't generate an artifact with the number of permitted iterations */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning!  Couldn't get appropriate power level on artifact.\n");

	/* Cleanup a_old */
	mem_free(a_old->slays);
	mem_free(a_old->brands);
	mem_free(a_old->curses);
	mem_free(a_old);

	/* Set rarity based on power */
	alloc_new = 4000000 / (ap * ap);
	alloc_new /= (kind->alloc_prob ? kind->alloc_prob : 20);
	if (alloc_new > 99) alloc_new = 99;
	if (alloc_new < 1) alloc_new = 1;
	art->alloc_prob = alloc_new;


	/* Set depth according to power */
	art->alloc_max = MIN(127, (ap * 3) / 5);
	art->alloc_min = MIN(100, ((ap + 100) * 100 / data->max_power));

	/* Have a chance to be less rare or deep, more likely the less power */
	if (one_in_(5 + (power / 20))) {
		art->alloc_prob += randint1(20);
		if (art->alloc_prob > 99) art->alloc_prob = 99;
	} else if (one_in_(5 + (power / 20))) {
		art->alloc_min /= 2;
		if (art->alloc_min < 1) art->alloc_min = 1;
	}

	/* Sanity check */
	art->alloc_max = MAX(art->alloc_max, MIN(art->alloc_min * 2, 127));

	/*
	 * If there is no activation or effect from the kind, level currently
	 * does nothing.  Set it to alloc_min in case changes elsewhere start
	 * using level for the artifact.
	 */
	if (!art->activation && !kind->activation && !kind->effect) {
		art->level = art->alloc_min;
	}

	file_putf(log_file, "New depths are min %d, max %d\n", art->alloc_min,
			  art->alloc_max);
	file_putf(log_file, "Power-based alloc_prob is %d\n", art->alloc_prob);

	/* Success */
	file_putf(log_file, "<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
	file_putf(log_file, "Number of tries for artifact %d was: %d\n", *aidx,
			  tries);

	/* Describe it */
	describe_artifact(*aidx, ap);
}